

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_tec(REF_GRID ref_grid,char *filename)

{
  int faceid;
  REF_GEOM pRVar1;
  uint uVar2;
  FILE *__s;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  REF_INT id;
  int iVar6;
  int iVar7;
  REF_INT *edge_faces;
  uint local_4c;
  REF_INT *local_40;
  REF_GEOM local_38;
  
  pRVar1 = ref_grid->geom;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xdf6,
           "ref_geom_tec","unable to open file");
    local_4c = 2;
  }
  else {
    fwrite("title=\"refine cad coupling in tecplot format\"\n",0x2e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"gap\" \"p0\" \"p1\" \"k0\" \"k1\"\n",0x32,1,__s);
    if ((long)pRVar1->max < 1) {
      iVar5 = 0x7fffffff;
      iVar7 = -0x80000000;
    }
    else {
      iVar7 = -0x80000000;
      iVar5 = 0x7fffffff;
      lVar3 = 0;
      do {
        if (*(int *)((long)pRVar1->descr + lVar3) == 1) {
          iVar6 = *(int *)((long)pRVar1->descr + lVar3 + 4);
          if (iVar6 <= iVar5) {
            iVar5 = iVar6;
          }
          if (iVar7 <= iVar6) {
            iVar7 = iVar6;
          }
        }
        lVar3 = lVar3 + 0x18;
      } while ((long)pRVar1->max * 0x18 != lVar3);
    }
    local_38 = pRVar1;
    if (iVar5 <= iVar7) {
      id = iVar5;
      do {
        uVar2 = ref_geom_edge_tec_zone(ref_grid,id,(FILE *)__s);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xe05,"ref_geom_tec",(ulong)uVar2,"tec edge");
          return uVar2;
        }
        id = id + 1;
      } while (iVar7 + 1 != id);
    }
    if (local_38->model != (void *)0x0) {
      uVar2 = ref_egads_edge_faces(local_38,&local_40);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xe08,"ref_geom_tec",(ulong)uVar2,"edge faces");
        return uVar2;
      }
      if (iVar5 <= iVar7) {
        iVar6 = iVar5 * 2 + -1;
        do {
          faceid = local_40[iVar6 + -1];
          if (faceid == local_40[iVar6]) {
            uVar2 = ref_geom_pcrv_tec_zone(ref_grid,iVar5,faceid,1,(FILE *)__s);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xe0e,"ref_geom_tec",(ulong)uVar2,"tec pcrv");
              return uVar2;
            }
            uVar2 = ref_geom_pcrv_tec_zone(ref_grid,iVar5,local_40[iVar6],-1,(FILE *)__s);
            if (uVar2 != 0) {
              uVar4 = 0xe11;
LAB_0017459d:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,uVar4,"ref_geom_tec",(ulong)uVar2,"tec pcrv");
              local_4c = uVar2;
            }
LAB_001745b9:
            if (uVar2 != 0) {
              return local_4c;
            }
          }
          else {
            if ((faceid != -1) &&
               (uVar2 = ref_geom_pcrv_tec_zone(ref_grid,iVar5,faceid,0,(FILE *)__s), uVar2 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xe16,"ref_geom_tec",(ulong)uVar2,"tec pcrv");
              return uVar2;
            }
            if (local_40[iVar6] != -1) {
              uVar2 = ref_geom_pcrv_tec_zone(ref_grid,iVar5,local_40[iVar6],0,(FILE *)__s);
              if (uVar2 != 0) {
                uVar4 = 0xe1a;
                goto LAB_0017459d;
              }
              goto LAB_001745b9;
            }
          }
          iVar5 = iVar5 + 1;
          iVar6 = iVar6 + 2;
        } while (iVar7 + 1 != iVar5);
      }
      if (local_40 != (REF_INT *)0x0) {
        free(local_40);
      }
    }
    if ((long)local_38->max < 1) {
      iVar5 = 0x7fffffff;
      iVar7 = -0x80000000;
    }
    else {
      iVar7 = -0x80000000;
      iVar5 = 0x7fffffff;
      lVar3 = 0;
      do {
        if (*(int *)((long)local_38->descr + lVar3) == 2) {
          iVar6 = *(int *)((long)local_38->descr + lVar3 + 4);
          if (iVar6 <= iVar5) {
            iVar5 = iVar6;
          }
          if (iVar7 <= iVar6) {
            iVar7 = iVar6;
          }
        }
        lVar3 = lVar3 + 0x18;
      } while ((long)local_38->max * 0x18 != lVar3);
    }
    if (iVar5 <= iVar7) {
      do {
        uVar2 = ref_geom_face_tec_zone(ref_grid,iVar5,(FILE *)__s);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xe28,"ref_geom_tec",(ulong)uVar2,"tec face");
          return uVar2;
        }
        iVar5 = iVar5 + 1;
      } while (iVar7 + 1 != iVar5);
    }
    fclose(__s);
    local_4c = 0;
  }
  return local_4c;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tec(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT geom, id, min_id, max_id;
  REF_INT *edge_faces;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine cad coupling in tecplot format\"\n");
  fprintf(
      file,
      "variables = \"x\" \"y\" \"z\" \"gap\" \"p0\" \"p1\" \"k0\" \"k1\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_edge(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_edge_tec_zone(ref_grid, id, file), "tec edge");

  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_edge_faces(ref_geom, &edge_faces), "edge faces");
    for (id = min_id; id <= max_id; id++) {
      if (edge_faces[0 + 2 * (id - 1)] ==
          edge_faces[1 + 2 * (id - 1)]) { /* edge used twice by face */
        RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[0 + 2 * (id - 1)],
                                   1, file),
            "tec pcrv");
        RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[1 + 2 * (id - 1)],
                                   -1, file),
            "tec pcrv");
      } else { /* edge used by two faces */
        if (REF_EMPTY != edge_faces[0 + 2 * (id - 1)])
          RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[0 + 2 * (id - 1)],
                                     0, file),
              "tec pcrv");
        if (REF_EMPTY != edge_faces[1 + 2 * (id - 1)])
          RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[1 + 2 * (id - 1)],
                                     0, file),
              "tec pcrv");
      }
    }
    ref_free(edge_faces);
  }

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_face_tec_zone(ref_grid, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}